

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgstrs.c
# Opt level: O3

void sgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  float *pfVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  float *Mxvec;
  float *addr;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong n;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  float fVar30;
  ulong local_1c0;
  int ii;
  
  *info = 0;
  if (CONJ < trans) {
    ii = 1;
    iVar24 = -1;
LAB_001034e0:
    *info = iVar24;
    input_error("sgstrs",&ii);
    return;
  }
  uVar1 = L->nrow;
  n = (ulong)uVar1;
  ii = 2;
  iVar24 = -2;
  if (((((int)uVar1 < 0) || (uVar1 != L->ncol)) || (L->Stype != SLU_SC)) ||
     ((L->Dtype != SLU_S || (L->Mtype != SLU_TRLU)))) goto LAB_001034e0;
  ii = 3;
  iVar24 = -3;
  if (((U->nrow < 0) || ((U->nrow != U->ncol || (U->Stype != SLU_NC)))) ||
     ((U->Dtype != SLU_S || (U->Mtype != SLU_TRU)))) goto LAB_001034e0;
  puVar5 = (uint *)B->Store;
  uVar18 = *puVar5;
  lVar22 = (long)(int)uVar18;
  ii = 6;
  iVar24 = -6;
  if (((((int)uVar18 < (int)uVar1) || (B->Stype != SLU_DN)) || (B->Dtype != SLU_S)) ||
     (B->Mtype != SLU_GE)) goto LAB_001034e0;
  uVar2 = B->ncol;
  uVar14 = (ulong)uVar2;
  Mxvec = floatCalloc((long)(int)uVar2 * n);
  if (Mxvec == (float *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  addr = floatMalloc(n);
  if (addr == (float *)0x0) {
    sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8e,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c");
    superlu_abort_and_exit((char *)&ii);
  }
  pfVar6 = *(float **)(puVar5 + 2);
  if (trans == NOTRANS) {
    pvVar7 = L->Store;
    lVar8 = *(long *)((long)pvVar7 + 8);
    pvVar9 = U->Store;
    lVar10 = *(long *)((long)pvVar9 + 8);
    if (0 < (int)uVar2) {
      uVar15 = 0;
      pfVar17 = pfVar6;
      do {
        if (uVar1 != 0) {
          uVar19 = 0;
          do {
            addr[perm_r[uVar19]] = pfVar17[uVar19];
            uVar19 = uVar19 + 1;
          } while (n != uVar19);
          if (uVar1 != 0) {
            uVar19 = 0;
            do {
              pfVar17[uVar19] = addr[uVar19];
              uVar19 = uVar19 + 1;
            } while (n != uVar19);
          }
        }
        uVar15 = uVar15 + 1;
        pfVar17 = pfVar17 + uVar18;
      } while (uVar15 != uVar14);
    }
    uVar18 = *(uint *)((long)pvVar7 + 4);
    if ((int)uVar18 < 0) {
      fVar30 = 0.0;
    }
    else {
      fVar30 = 0.0;
      lVar16 = 0;
      do {
        lVar25 = (long)*(int *)(*(long *)((long)pvVar7 + 0x30) + lVar16 * 4);
        uVar3 = *(uint *)(*(long *)((long)pvVar7 + 0x20) + lVar25 * 4);
        iVar24 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 + lVar25 * 4);
        iVar12 = iVar24 - uVar3;
        lVar23 = *(int *)(*(long *)((long)pvVar7 + 0x30) + 4 + lVar16 * 4) - lVar25;
        iVar21 = (int)lVar23;
        iVar13 = iVar12 - iVar21;
        if (iVar21 == 1) {
          if (0 < (int)uVar2) {
            iVar12 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar25 * 4);
            uVar15 = 0;
            do {
              if ((int)(uVar3 + 1) < iVar24) {
                lVar26 = uVar15 * lVar22;
                lVar23 = *(long *)((long)pvVar7 + 0x18);
                lVar27 = 0;
                do {
                  lVar28 = (long)*(int *)(lVar23 + (long)(int)uVar3 * 4 + 4 + lVar27 * 4);
                  pfVar6[lVar26 + lVar28] =
                       pfVar6[lVar26 + lVar28] -
                       pfVar6[lVar26 + lVar25] *
                       *(float *)(lVar8 + 4 + (long)iVar12 * 4 + lVar27 * 4);
                  lVar27 = lVar27 + 1;
                } while (~uVar3 + iVar24 != (int)lVar27);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar14);
          }
        }
        else if (0 < (int)uVar2) {
          lVar26 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar25 * 4);
          uVar15 = 0;
          do {
            lVar27 = uVar15 * lVar22;
            slsolve(iVar12,iVar21,(float *)(lVar8 + lVar26 * 4),pfVar6 + lVar27 + lVar25);
            smatvec(iVar12,iVar13,iVar21,(float *)(lVar8 + (lVar23 + lVar26) * 4),
                    pfVar6 + lVar27 + lVar25,Mxvec);
            if (0 < iVar13) {
              lVar28 = *(long *)((long)pvVar7 + 0x18);
              lVar29 = 0;
              do {
                lVar20 = (long)*(int *)(lVar28 + (long)(int)(uVar3 + iVar21) * 4 + lVar29 * 4);
                pfVar6[lVar27 + lVar20] = pfVar6[lVar27 + lVar20] - Mxvec[lVar29];
                Mxvec[lVar29] = 0.0;
                lVar29 = lVar29 + 1;
              } while (lVar29 < iVar13);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar14);
          uVar18 = *(uint *)((long)pvVar7 + 4);
        }
        fVar30 = (float)(int)(uVar2 * 2 * iVar21 * iVar13) +
                 fVar30 + (float)(int)(iVar21 * uVar2 * (iVar21 + -1));
        bVar11 = lVar16 < (int)uVar18;
        lVar16 = lVar16 + 1;
      } while (bVar11);
      if (-1 < (int)uVar18) {
        uVar15 = (ulong)uVar18;
        do {
          iVar24 = *(int *)(*(long *)((long)pvVar7 + 0x30) + uVar15 * 4);
          lVar23 = (long)iVar24;
          iVar12 = *(int *)(*(long *)((long)pvVar7 + 0x30) + 4 + uVar15 * 4);
          iVar13 = iVar12 - iVar24;
          lVar16 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar23 * 4);
          fVar30 = (float)(int)(iVar13 * uVar2 * (iVar13 + 1)) + fVar30;
          if (iVar13 == 1) {
            if (0 < (int)uVar2) {
              pfVar17 = pfVar6 + lVar23;
              uVar19 = uVar14;
              do {
                *pfVar17 = *pfVar17 / *(float *)(lVar8 + lVar16 * 4);
                pfVar17 = pfVar17 + lVar22;
                uVar18 = (int)uVar19 - 1;
                uVar19 = (ulong)uVar18;
              } while (uVar18 != 0);
LAB_00103c33:
              if (0 < (int)uVar2) {
                uVar19 = 0;
                do {
                  if (iVar24 < iVar12) {
                    lVar26 = uVar19 * lVar22;
                    lVar16 = *(long *)((long)pvVar9 + 0x18);
                    lVar25 = lVar23;
                    iVar13 = *(int *)(lVar16 + lVar23 * 4);
                    do {
                      iVar21 = *(int *)(lVar16 + 4 + lVar25 * 4);
                      if (iVar21 - iVar13 != 0 && iVar13 <= iVar21) {
                        lVar27 = *(long *)((long)pvVar9 + 0x10);
                        lVar28 = (long)iVar13;
                        do {
                          lVar29 = (long)*(int *)(lVar27 + lVar28 * 4);
                          pfVar6[lVar26 + lVar29] =
                               pfVar6[lVar26 + lVar29] -
                               pfVar6[lVar26 + lVar25] * *(float *)(lVar10 + lVar28 * 4);
                          lVar28 = lVar28 + 1;
                        } while (iVar21 != lVar28);
                      }
                      lVar25 = lVar25 + 1;
                      fVar30 = fVar30 + (float)((iVar21 - iVar13) * 2);
                      iVar13 = iVar21;
                    } while (lVar25 != iVar12);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar14);
              }
            }
          }
          else if (0 < (int)uVar2) {
            iVar21 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 + lVar23 * 4);
            iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x20) + lVar23 * 4);
            pfVar17 = pfVar6 + lVar23;
            uVar19 = uVar14;
            do {
              susolve(iVar21 - iVar4,iVar13,(float *)(lVar8 + lVar16 * 4),pfVar17);
              pfVar17 = pfVar17 + lVar22;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            goto LAB_00103c33;
          }
          bVar11 = 0 < (long)uVar15;
          uVar15 = uVar15 - 1;
        } while (bVar11);
      }
    }
    if (0 < (int)uVar2) {
      uVar15 = 0;
      pfVar17 = pfVar6;
      do {
        if (0 < (int)uVar1) {
          uVar19 = 0;
          do {
            addr[uVar19] = pfVar6[uVar15 * lVar22 + (long)perm_c[uVar19]];
            uVar19 = uVar19 + 1;
          } while (n != uVar19);
          if (0 < (int)uVar1) {
            uVar19 = 0;
            do {
              pfVar17[uVar19] = addr[uVar19];
              uVar19 = uVar19 + 1;
            } while (n != uVar19);
          }
        }
        uVar15 = uVar15 + 1;
        pfVar17 = pfVar17 + lVar22;
      } while (uVar15 != uVar14);
    }
  }
  else {
    if (0 < (int)uVar2) {
      uVar15 = 0;
      pfVar17 = pfVar6;
      do {
        if (n != 0) {
          uVar19 = 0;
          do {
            addr[perm_c[uVar19]] = pfVar17[uVar19];
            uVar19 = uVar19 + 1;
          } while (n != uVar19);
          if (n != 0) {
            uVar19 = 0;
            do {
              pfVar17[uVar19] = addr[uVar19];
              uVar19 = uVar19 + 1;
            } while (n != uVar19);
          }
        }
        uVar15 = uVar15 + 1;
        pfVar17 = pfVar17 + uVar18;
      } while (uVar15 != uVar14);
      stat->ops[0x11] = 0.0;
      pfVar17 = pfVar6;
      local_1c0 = uVar14;
      if (0 < (int)uVar2) {
        do {
          sp_strsv("U","T","N",L,U,pfVar17,stat,info);
          sp_strsv("L","T","U",L,U,pfVar17,stat,info);
          local_1c0 = local_1c0 - 1;
          pfVar17 = pfVar17 + lVar22;
        } while (local_1c0 != 0);
        if (0 < (int)uVar2) {
          uVar15 = 0;
          pfVar17 = pfVar6;
          do {
            if (0 < (int)uVar1) {
              uVar19 = 0;
              do {
                addr[uVar19] = pfVar6[uVar15 * lVar22 + (long)perm_r[uVar19]];
                uVar19 = uVar19 + 1;
              } while (n != uVar19);
              if (0 < (int)uVar1) {
                uVar19 = 0;
                do {
                  pfVar17[uVar19] = addr[uVar19];
                  uVar19 = uVar19 + 1;
                } while (n != uVar19);
              }
            }
            uVar15 = uVar15 + 1;
            pfVar17 = pfVar17 + lVar22;
          } while (uVar15 != uVar14);
        }
      }
      goto LAB_00103d95;
    }
    fVar30 = 0.0;
  }
  stat->ops[0x11] = fVar30;
LAB_00103d95:
  superlu_free(Mxvec);
  superlu_free(addr);
  return;
}

Assistant:

void
sgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    float   alpha = 1.0, beta = 1.0;
    float   *work_col;
#endif
    DNformat *Bstore;
    float   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    float   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void sprint_soln(int n, int nrhs, const float *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_S || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_S || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_S || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("sgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = floatCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = floatMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 2 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			rhs_work[irow] -= rhs_work[fsupc] * Lval[luptr];
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		STRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		SGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		strsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		sgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work_col[i]; /* Scatter */
			work_col[i] = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    slsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    smatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work[i];
			work[i] = 0.0;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    rhs_work[fsupc] /= Lval[luptr];
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		STRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		strsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    susolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			rhs_work[irow] -= rhs_work[jcol] * Uval[i];
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
	for (k = 0; k < nrhs; ++k) {
	    
	    /* Multiply by inv(U'). */
	    sp_strsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	    /* Multiply by inv(L'). */
	    sp_strsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	}
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}